

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O1

Result<Sample> * __thiscall
vkb::Result<Sample>::operator=(Result<Sample> *this,Result<Sample> *result)

{
  bool bVar1;
  int *piVar2;
  
  if (this->m_init == true) {
    (this->field_0).m_value._vptr_Sample = (_func_int **)&PTR__Sample_001cae90;
    piVar2 = (this->field_0).m_value.data;
    if (piVar2 != (int *)0x0) {
      operator_delete(piVar2,4);
    }
  }
  bVar1 = result->m_init;
  this->m_init = bVar1;
  if (bVar1 == true) {
    (this->field_0).m_value._vptr_Sample = (_func_int **)&PTR__Sample_001cae90;
    piVar2 = (int *)operator_new(4);
    (this->field_0).m_value.data = piVar2;
    *piVar2 = *(result->field_0).m_value.data;
  }
  else {
    (this->field_0).m_error.vk_result = (result->field_0).m_error.vk_result;
    piVar2 = (result->field_0).m_value.data;
    (this->field_0).m_value._vptr_Sample = (result->field_0).m_value._vptr_Sample;
    (this->field_0).m_value.data = piVar2;
  }
  return this;
}

Assistant:

Result& operator=(Result const& result) noexcept {
        destroy();
        m_init = result.m_init;
        if (m_init)
            new (&m_value) T{ result.m_value };
        else
            m_error = result.m_error;
        return *this;
    }